

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teleport.c
# Opt level: O0

boolean safe_teleds(boolean allow_drag)

{
  bool bVar1;
  boolean bVar2;
  int x;
  int y;
  int local_18;
  int tcnt;
  int nuy;
  int nux;
  boolean allow_drag_local;
  
  local_18 = 0;
  do {
    x = rnd(0x4f);
    y = rn2(0x15);
    bVar2 = teleok(x,y,200 < local_18);
    bVar1 = false;
    if (bVar2 == '\0') {
      local_18 = local_18 + 1;
      bVar1 = local_18 < 0x191;
    }
  } while (bVar1);
  if (local_18 < 0x191) {
    teleds(x,y,allow_drag);
  }
  return local_18 < 0x191;
}

Assistant:

boolean safe_teleds(boolean allow_drag)
{
	int nux, nuy, tcnt = 0;

	do {
		nux = rnd(COLNO-1);
		nuy = rn2(ROWNO);
	} while (!teleok(nux, nuy, (boolean)(tcnt > 200)) && ++tcnt <= 400);

	if (tcnt <= 400) {
		teleds(nux, nuy, allow_drag);
		return TRUE;
	} else
		return FALSE;
}